

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

QSize __thiscall QWatermarkLabel::minimumSizeHint(QWatermarkLabel *this)

{
  char cVar1;
  QSize QVar2;
  long in_FS_OFFSET;
  QSizeF local_48;
  QPixmap local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::pixmap((QLabel *)local_38);
  cVar1 = QPixmap::isNull();
  QPixmap::~QPixmap(local_38);
  if (cVar1 == '\0') {
    QLabel::pixmap((QLabel *)local_38);
    local_48.wd = (qreal)QPixmap::deviceIndependentSize();
    QVar2 = QSizeF::toSize(&local_48);
    QPixmap::~QPixmap(local_38);
  }
  else {
    QVar2 = QWidget::minimumSizeHint((QWidget *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize minimumSizeHint() const override {
        if (!pixmap().isNull())
            return pixmap().deviceIndependentSize().toSize();
        return QFrame::minimumSizeHint();
    }